

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<CallbackEvent>::dispose(ArrayBuilder<CallbackEvent> *this)

{
  CallbackEvent *firstElement;
  RemoveConst<CallbackEvent> *pRVar1;
  CallbackEvent *pCVar2;
  CallbackEvent *endCopy;
  CallbackEvent *posCopy;
  CallbackEvent *ptrCopy;
  ArrayBuilder<CallbackEvent> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pCVar2 = this->endPtr;
  if (firstElement != (CallbackEvent *)0x0) {
    this->ptr = (CallbackEvent *)0x0;
    this->pos = (RemoveConst<CallbackEvent> *)0x0;
    this->endPtr = (CallbackEvent *)0x0;
    ArrayDisposer::dispose<kj::(anonymous_namespace)::TestCase3108::run()::CallbackEvent>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 3,
               (long)pCVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }